

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
::fulfill(AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
          *this,Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *value)

{
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *value_00;
  ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> local_1e8;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *local_18;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *value_local;
  AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)this;
    value_00 = mv<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>(value);
    ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
    ExceptionOr(&local_1e8,value_00);
    ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
    operator=(&this->result,&local_1e8);
    ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
    ~ExceptionOr(&local_1e8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }